

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3D.h
# Opt level: O3

void __thiscall CMU462::Application::update_style(Application *this)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = (this->camera).pos.x - (this->camera).targetPos.x;
  dVar4 = (this->camera).pos.y - (this->camera).targetPos.y;
  dVar5 = (this->camera).pos.z - (this->camera).targetPos.z;
  fVar1 = (float)(this->canonical_view_distance /
                 (double)(float)SQRT(dVar5 * dVar5 + dVar3 * dVar3 + dVar4 * dVar4));
  fVar2 = fVar1 * 2.0;
  fVar1 = fVar1 * 8.0;
  (this->hoverStyle).strokeWidth = fVar2;
  (this->hoverStyle).vertexRadius = fVar1;
  (this->selectStyle).strokeWidth = fVar2;
  (this->selectStyle).vertexRadius = fVar1;
  return;
}

Assistant:

Vector3D( const Vector3D& v ) : x( v.x ), y( v.y ), z( v.z ) { }